

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_scale_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_29d038f::HighBDConvolveScaleTest::SetUp(HighBDConvolveScaleTest *this)

{
  int iVar1;
  undefined4 uVar2;
  _Tuple_impl<0UL,_int,_int> _Var3;
  pointer puVar4;
  undefined4 uVar5;
  uint uVar6;
  ParamType *pPVar7;
  ParamType *pPVar8;
  TestImage<unsigned_short> *pTVar9;
  pointer *__ptr;
  SEARCH_METHODS *message;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  AssertHelper local_40;
  char local_38;
  undefined8 *local_30;
  
  pPVar7 = testing::
           WithParamInterface<std::tuple<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*,_int),_std::tuple<int,_int>,_int>_>
           ::GetParam();
  this->tst_fun_ =
       (HighbdConvolveFunc)
       (pPVar7->
       super__Tuple_impl<0UL,_void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*,_int),_std::tuple<int,_int>,_int>
       ).
       super__Head_base<0UL,_void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*,_int),_false>
       ._M_head_impl;
  pPVar7 = testing::
           WithParamInterface<std::tuple<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*,_int),_std::tuple<int,_int>,_int>_>
           ::GetParam();
  pPVar8 = testing::
           WithParamInterface<std::tuple<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*,_int),_std::tuple<int,_int>,_int>_>
           ::GetParam();
  iVar1 = (pPVar8->
          super__Tuple_impl<0UL,_void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*,_int),_std::tuple<int,_int>,_int>
          ).super__Tuple_impl<1UL,_std::tuple<int,_int>,_int>.super__Tuple_impl<2UL,_int>.
          super__Head_base<2UL,_int,_false>._M_head_impl;
  _Var3 = (pPVar7->
          super__Tuple_impl<0UL,_void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_int,_int,_ConvolveParams_*,_int),_std::tuple<int,_int>,_int>
          ).super__Tuple_impl<1UL,_std::tuple<int,_int>,_int>.
          super__Head_base<1UL,_std::tuple<int,_int>,_false>._M_head_impl.
          super__Tuple_impl<0UL,_int,_int>;
  (this->super_ConvolveScaleTestBase<unsigned_short>).width_ =
       _Var3.super__Head_base<0UL,_int,_false>._M_head_impl._M_head_impl;
  (this->super_ConvolveScaleTestBase<unsigned_short>).height_ =
       (int)_Var3.super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl.
            super__Head_base<1UL,_int,_false>;
  (this->super_ConvolveScaleTestBase<unsigned_short>).bd_ = iVar1;
  pTVar9 = (this->super_ConvolveScaleTestBase<unsigned_short>).image_;
  if (pTVar9 != (TestImage<unsigned_short> *)0x0) {
    puVar4 = (pTVar9->dst_16_data_).
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (puVar4 != (pointer)0x0) {
      operator_delete(puVar4);
    }
    puVar4 = (pTVar9->dst_data_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (puVar4 != (pointer)0x0) {
      operator_delete(puVar4);
    }
    puVar4 = (pTVar9->src_data_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (puVar4 != (pointer)0x0) {
      operator_delete(puVar4);
    }
    operator_delete(pTVar9);
  }
  pTVar9 = (TestImage<unsigned_short> *)operator_new(0x60);
  iVar1 = (this->super_ConvolveScaleTestBase<unsigned_short>).width_;
  pTVar9->w_ = iVar1;
  uVar2 = (this->super_ConvolveScaleTestBase<unsigned_short>).height_;
  uVar5 = (this->super_ConvolveScaleTestBase<unsigned_short>).bd_;
  pTVar9->h_ = uVar2;
  pTVar9->bd_ = uVar5;
  uVar6 = iVar1 + 0x4fU & 0xfffffff0;
  (pTVar9->dst_16_data_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (pTVar9->dst_16_data_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (pTVar9->dst_data_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pTVar9->dst_data_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pTVar9->src_data_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pTVar9->dst_data_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pTVar9->src_data_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pTVar9->src_data_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pTVar9->dst_16_data_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar9->src_stride_ = uVar6;
  pTVar9->dst_stride_ = uVar6 + 0x10;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (&pTVar9->src_data_,(long)(int)((uVar2 + 0x40) * uVar6 * 2));
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (&pTVar9->dst_data_,(long)((pTVar9->h_ + 0x40) * pTVar9->dst_stride_ * 2));
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (&pTVar9->dst_16_data_,(long)((pTVar9->h_ + 0x40) * pTVar9->dst_stride_ * 2));
  (this->super_ConvolveScaleTestBase<unsigned_short>).image_ = pTVar9;
  testing::AssertionSuccess();
  if (local_38 == '\0') {
    testing::Message::Message((Message *)&local_48);
    if (local_30 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (SEARCH_METHODS *)*local_30;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_convolve_scale_test.cc"
               ,0xcf,(char *)message);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
  }
  if (local_30 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_30 != local_30 + 2) {
      operator_delete((undefined8 *)*local_30);
    }
    operator_delete(local_30);
  }
  return;
}

Assistant:

void SetUp() override {
    tst_fun_ = GET_PARAM(0);

    const BlockDimension &block = GET_PARAM(1);
    const int bd = GET_PARAM(2);

    SetParams(BaseParams(block), bd);
  }